

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::conv3x3s1_winograd23_transform_kernel_int8_avx2
               (Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  void *pvVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  uint max_ii;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  short *psVar14;
  int k;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint max_kk;
  char *pcVar18;
  long lVar19;
  int m_1;
  long lVar20;
  ulong uVar21;
  undefined8 local_170;
  Mat local_168;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  Mat *local_108;
  ulong local_100;
  short *local_f8;
  long local_f0;
  Mat *local_e8;
  long local_e0;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat local_c8;
  Mat m;
  
  local_e8 = kernel;
  get_optimal_tile_mnk_int8(outch,0,inch,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
  local_120 = (ulong)(uint)TILE_M;
  uVar16 = (long)(outch + TILE_M + -1) / (long)TILE_M;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  local_118 = (ulong)(uint)outch;
  Mat::create(&local_c8,TILE_K * TILE_M * 0x10,1,opt->num_threads,2,(Allocator *)0x0);
  iVar10 = (int)uVar16;
  local_170 = (long)TILE_K;
  local_108 = AT;
  Mat::create(AT,TILE_K * TILE_M,0x10,(inch + TILE_K + -1) / TILE_K,iVar10,2,(Allocator *)0x0);
  local_110 = uVar16 & 0xffffffff;
  if (iVar10 < 1) {
    local_110 = 0;
  }
  local_f0 = (long)inch;
  local_100 = (ulong)(uint)inch;
  for (uVar16 = 0; uVar16 != local_110; uVar16 = uVar16 + 1) {
    iVar10 = get_omp_thread_num();
    m.elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    local_f8 = (short *)((long)iVar10 * local_c8.cstep * m.elemsize + (long)local_c8.data);
    m.data = local_f8;
    m.refcount = (int *)0x0;
    m.elempack = local_c8.elempack;
    m.allocator = local_c8.allocator;
    m.w = local_c8.w;
    m.h = local_c8.h;
    m.d = 1;
    m.c = local_c8.d;
    m.cstep = (m.elemsize * (long)local_c8.h * (long)local_c8.w + 0xf & 0xfffffffffffffff0) /
              m.elemsize;
    m.dims = local_c8.dims + -1;
    if (local_c8.dims == 4) {
      m.cstep = (long)local_c8.h * (long)local_c8.w;
    }
    local_e0 = uVar16 * local_120;
    max_ii = (int)local_118 - (int)(uVar16 * local_120);
    if ((int)(uint)local_120 < (int)max_ii) {
      max_ii = (uint)local_120;
    }
    uVar21 = 0;
    if (0 < (int)max_ii) {
      uVar21 = (ulong)max_ii;
    }
    for (uVar15 = 0; lVar9 = local_170, (long)uVar15 < local_f0; uVar15 = uVar15 + lVar9) {
      max_kk = (int)local_100 - (int)uVar15;
      uVar11 = (uint)local_170;
      if ((int)uVar11 < (int)max_kk) {
        max_kk = uVar11;
      }
      uVar12 = 0;
      if (0 < (int)max_kk) {
        uVar12 = (ulong)max_kk;
      }
      psVar14 = local_f8;
      for (uVar13 = 0; uVar13 != uVar21; uVar13 = uVar13 + 1) {
        pvVar7 = local_e8->data;
        for (uVar17 = 0; uVar17 != uVar12; uVar17 = uVar17 + 1) {
          pcVar18 = (char *)((long)pvVar7 +
                            (uVar17 + uVar15) * 9 + (long)(((int)local_e0 + (int)uVar13) * inch * 9)
                            );
          for (lVar20 = 0; lVar19 = 4, lVar20 != 3; lVar20 = lVar20 + 1) {
            cVar1 = *pcVar18;
            cVar2 = pcVar18[1];
            cVar3 = pcVar18[2];
            *(short *)((long)&local_168.data + lVar20 * 2) = cVar1 * 2;
            *(short *)((long)&local_168.data + lVar20 * 2 + 6) =
                 (short)cVar2 + (short)cVar1 + (short)cVar3;
            *(short *)((long)&local_168.refcount + lVar20 * 2 + 4) =
                 ((short)cVar1 - (short)cVar2) + (short)cVar3;
            *(short *)((long)&local_168.elemsize + lVar20 * 2 + 2) = (short)cVar3 + (short)cVar3;
            pcVar18 = pcVar18 + 3;
          }
          for (; lVar19 != 0x1c; lVar19 = lVar19 + 6) {
            sVar4 = *(short *)((long)&local_170 + lVar19 + 4);
            sVar5 = *(short *)((long)&local_170 + lVar19 + 6);
            sVar6 = *(short *)((long)&local_168.data + lVar19);
            *psVar14 = sVar4 * 2;
            psVar14[1] = sVar5 + sVar4 + sVar6;
            psVar14[2] = (sVar4 - sVar5) + sVar6;
            psVar14[3] = sVar6 * 2;
            psVar14 = psVar14 + 4;
          }
        }
      }
      local_168.w = local_108->w;
      local_168.h = local_108->h;
      local_168.elemsize = local_108->elemsize;
      local_168.elempack = local_108->elempack;
      local_168.allocator = local_108->allocator;
      local_168.cstep = (long)local_168.h * (long)local_168.w;
      local_168.data =
           (void *)((long)local_108->data +
                   local_168.elemsize * local_168.cstep *
                   (long)(int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 |
                                     uVar15 & 0xffffffff) / (long)(int)uVar11) +
                   local_108->cstep * uVar16 * local_168.elemsize);
      local_168.refcount = (int *)0x0;
      local_168.dims = 2;
      local_168.d = 1;
      local_168.c = 1;
      pack_A_tile_int8(&m,&local_168,0x10,max_ii,max_kk);
    }
  }
  piVar8 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd23_transform_kernel_int8_avx2(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd23_transform_kernel_int8(kernel, AT, inch, outch, opt);
}